

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileClasses.cpp
# Opt level: O0

char32_t __thiscall TextFile::readCharacter(TextFile *this)

{
  byte bVar1;
  uchar uVar2;
  bool bVar3;
  unsigned_short uVar4;
  char32_t cVar5;
  char16_t *pcVar6;
  long pos_00;
  char32_t nextValue;
  long pos;
  string local_90;
  _Optional_payload_base<char16_t> local_6e;
  ushort local_6a;
  undefined1 local_68 [2];
  optional<char16_t> unicode;
  unsigned_short sjis;
  int local_44;
  int b;
  int i;
  int local_20;
  char32_t local_1c;
  int extraBytes;
  char32_t value;
  TextFile *this_local;
  
  local_1c = L'\0';
  _extraBytes = this;
  switch(this->encoding) {
  case ASCII:
    bVar1 = bufGetChar(this);
    local_1c = (char32_t)bVar1;
    this->contentPos = this->contentPos + 1;
    break;
  case UTF8:
    bVar1 = bufGetChar(this);
    local_1c = (char32_t)bVar1;
    local_20 = 0;
    if ((local_1c & 0xe0U) == 0xc0) {
      local_20 = 1;
      local_1c = local_1c & 0x1f;
    }
    else if ((local_1c & 0xf0U) == 0xe0) {
      local_20 = 2;
      local_1c = local_1c & 0xf;
    }
    else if (0x7f < (uint)local_1c) {
      tinyformat::format<>((string *)&b,"One or more invalid UTF-8 characters in this file");
      std::__cxx11::string::operator=((string *)&this->errorText,(string *)&b);
      std::__cxx11::string::~string((string *)&b);
    }
    for (local_44 = 0; local_44 < local_20; local_44 = local_44 + 1) {
      bVar1 = bufGetChar(this);
      if ((bVar1 & 0xc0) != 0x80) {
        tinyformat::format<>((string *)local_68,"One or more invalid UTF-8 characters in this file")
        ;
        std::__cxx11::string::operator=((string *)&this->errorText,(string *)local_68);
        std::__cxx11::string::~string((string *)local_68);
      }
      local_1c = local_1c << 6 | bVar1 & 0x3f;
    }
    break;
  case UTF16LE:
    uVar4 = bufGet16LE(this);
    local_1c = (char32_t)uVar4;
    break;
  case UTF16BE:
    uVar4 = bufGet16BE(this);
    local_1c = (char32_t)uVar4;
    break;
  case SJIS:
    bVar1 = bufGetChar(this);
    local_6a = (ushort)bVar1;
    if (0x7f < local_6a) {
      uVar2 = bufGetChar(this);
      local_6a = CONCAT11(bVar1,uVar2);
    }
    local_6e = (_Optional_payload_base<char16_t>)sjisToUnicode(local_6a);
    bVar3 = std::optional::operator_cast_to_bool((optional *)&local_6e);
    if (bVar3) {
      pcVar6 = std::optional<char16_t>::operator*((optional<char16_t> *)&local_6e);
      local_1c = (char32_t)(ushort)*pcVar6;
    }
    else {
      tinyformat::format<>(&local_90,"One or more invalid Shift-JIS characters in this file");
      std::__cxx11::string::operator=((string *)&this->errorText,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
    }
    break;
  case GUESS:
    tinyformat::format<>((string *)&pos,"Cannot read from GUESS encoding");
    std::__cxx11::string::operator=((string *)&this->errorText,(string *)&pos);
    std::__cxx11::string::~string((string *)&pos);
  }
  if (((local_1c == L'\r') && ((this->recursion & 1U) == 0)) && (bVar3 = atEnd(this), !bVar3)) {
    this->recursion = true;
    pos_00 = tell(this);
    cVar5 = readCharacter(this);
    this->recursion = false;
    if (cVar5 == L'\n') {
      return L'\n';
    }
    seek(this,pos_00);
  }
  return local_1c;
}

Assistant:

char32_t TextFile::readCharacter()
{
	char32_t value = 0;

	switch (encoding)
	{
	case UTF8:
		{
			value = bufGetChar();
			
			int extraBytes = 0;
			if ((value & 0xE0) == 0xC0)
			{
				extraBytes = 1;
				value &= 0x1F;
			} else if ((value & 0xF0) == 0xE0)
			{
				extraBytes = 2;
				value &= 0x0F;
			} else if (value > 0x7F)
			{
				errorText = tfm::format("One or more invalid UTF-8 characters in this file");
			}

			for (int i = 0; i < extraBytes; i++)
			{
				int b = bufGetChar();
				if ((b & 0xC0) != 0x80)
				{
					errorText = tfm::format("One or more invalid UTF-8 characters in this file");
				}

				value = (value << 6) | (b & 0x3F);
			}
		}
		break;
	case UTF16LE:
		value = bufGet16LE();
		break;
	case UTF16BE:
		value = bufGet16BE();
		break;
	case SJIS:
		{
			unsigned short sjis = bufGetChar();
			if (sjis >= 0x80)
				sjis = (sjis << 8) | bufGetChar();

			if (auto unicode = sjisToUnicode(sjis))
				value = *unicode;
			else
				errorText = tfm::format("One or more invalid Shift-JIS characters in this file");
		}
		break;
	case ASCII:
		value = bufGetChar();
		contentPos++;
		break;

	case GUESS:
		errorText = tfm::format("Cannot read from GUESS encoding");
		break;
	}

	// convert \r\n to \n
	if (value == L'\r' && !recursion && !atEnd())
	{
		recursion = true;
		long pos = tell();
		char32_t nextValue = readCharacter();
		recursion = false;

		if (nextValue == L'\n')
			return nextValue;
		seek(pos);
	}

	return value;
}